

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  source_loc loc;
  source_loc loc_00;
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  logger *plVar5;
  char *pcVar6;
  string *psVar7;
  ulong uVar8;
  bool is_interactive;
  string_view exec_name;
  string_view exec_name_00;
  string_view exec_name_01;
  string server_addr;
  string db_command;
  UrsaClient client;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  char *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined8 local_110;
  string local_108;
  string local_e8;
  UrsaClient local_c8;
  
  local_130 = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"tcp://localhost:9281","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_110 = 0;
  iVar3 = isatty(0);
  is_interactive = iVar3 != 0;
  while( true ) {
    while( true ) {
      iVar3 = getopt(argc,argv,"hqjc:");
      sVar2 = local_108._M_string_length;
      pcVar1 = local_128;
      pcVar6 = _optarg;
      if (iVar3 != 99) break;
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)sVar2,(ulong)pcVar6);
    }
    if (iVar3 < 0x6a) break;
    if (iVar3 == 0x6a) {
      local_110 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
    }
    else {
      if (iVar3 != 0x71) {
LAB_0012ad2b:
        if (argc < 1) {
          pcVar6 = "ursacli";
        }
        else {
          pcVar6 = *argv;
        }
        sVar4 = strlen(pcVar6);
        exec_name._M_str = pcVar6;
        exec_name._M_len = sVar4;
        print_usage(exec_name);
        plVar5 = spdlog::default_logger_raw();
        local_c8.server_addr._M_dataplus._M_p = (pointer)0x0;
        local_c8.server_addr._M_string_length = 0;
        local_c8.server_addr.field_2._M_allocated_capacity = 0;
        loc_00.funcname = (char *)0x0;
        loc_00.filename = (char *)0x0;
        loc_00.line = 0;
        loc_00._12_4_ = 0;
        spdlog::logger::log<char[30],_nullptr>
                  (plVar5,loc_00,err,(char (*) [30])"Failed to parse command line.");
        iVar3 = 1;
LAB_0012afd2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        return iVar3;
      }
      is_interactive = false;
    }
  }
  if (iVar3 == -1) {
    if (argc - _optind < 2) {
      if (argc - _optind == 1) {
        pcVar6 = argv[_optind];
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)&local_130,0,pcVar1,(ulong)pcVar6);
      }
      if (local_130 == &local_120) {
        local_e8.field_2._8_8_ = local_120._8_8_;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)local_130;
      }
      local_e8.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
      local_e8.field_2._M_local_buf[0] = local_120._M_local_buf[0];
      psVar7 = &local_e8;
      local_e8._M_string_length = (size_type)local_128;
      local_128 = (char *)0x0;
      local_120._M_local_buf[0] = '\0';
      local_130 = &local_120;
      UrsaClient::UrsaClient(&local_c8,psVar7,is_interactive,(bool)((byte)local_110 & 1));
      iVar3 = (int)psVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        uVar8 = local_e8.field_2._M_allocated_capacity + 1;
        operator_delete(local_e8._M_dataplus._M_p,uVar8);
        iVar3 = (int)uVar8;
      }
      if ((char *)local_108._M_string_length == (char *)0x0) {
        UrsaClient::start(&local_c8);
      }
      else {
        psVar7 = &local_108;
        UrsaClient::one_shot_command(&local_c8,psVar7);
        iVar3 = (int)psVar7;
      }
      zmq::socket_t::close(&local_c8.status_socket,iVar3);
      zmq::socket_t::close(&local_c8.cmd_socket,iVar3);
      zmq::context_t::close(&local_c8.context,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.connection_id._M_dataplus._M_p != &local_c8.connection_id.field_2) {
        operator_delete(local_c8.connection_id._M_dataplus._M_p,
                        local_c8.connection_id.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.server_version._M_dataplus._M_p != &local_c8.server_version.field_2) {
        operator_delete(local_c8.server_version._M_dataplus._M_p,
                        local_c8.server_version.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.server_addr._M_dataplus._M_p != &local_c8.server_addr.field_2) {
        operator_delete(local_c8.server_addr._M_dataplus._M_p,
                        local_c8.server_addr.field_2._M_allocated_capacity + 1);
      }
      iVar3 = 0;
    }
    else {
      plVar5 = spdlog::default_logger_raw();
      local_c8.server_addr._M_dataplus._M_p = (pointer)0x0;
      local_c8.server_addr._M_string_length = 0;
      local_c8.server_addr.field_2._M_allocated_capacity = 0;
      loc.funcname = (char *)0x0;
      loc.filename = (char *)0x0;
      loc.line = 0;
      loc._12_4_ = 0;
      spdlog::logger::log<char[40],_nullptr>
                (plVar5,loc,err,(char (*) [40])"Too many positional arguments provided.");
      if (argc < 1) {
        pcVar6 = "ursacli";
      }
      else {
        pcVar6 = *argv;
      }
      sVar4 = strlen(pcVar6);
      iVar3 = 1;
      exec_name_01._M_str = pcVar6;
      exec_name_01._M_len = sVar4;
      print_usage(exec_name_01);
    }
    goto LAB_0012afd2;
  }
  if (iVar3 == 0x68) {
    if (argc < 1) {
      pcVar6 = "ursacli";
    }
    else {
      pcVar6 = *argv;
    }
    sVar4 = strlen(pcVar6);
    iVar3 = 0;
    exec_name_00._M_str = pcVar6;
    exec_name_00._M_len = sVar4;
    print_usage(exec_name_00);
    goto LAB_0012afd2;
  }
  goto LAB_0012ad2b;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string server_addr = "tcp://localhost:9281";
    std::string db_command;
    bool is_interactive = isatty(STDIN_FILENO) != 0;
    bool raw_json = false;

    int c;

    while ((c = getopt(argc, argv, "hqjc:")) != -1) {
        switch (c) {
            case 'q':
                is_interactive = false;
                break;
            case 'c':
                db_command = optarg;
                break;
            case 'j':
                raw_json = true;
                break;
            case 'h':
                print_usage(argc >= 1 ? argv[0] : "ursacli");
                return 0;
            default:
                print_usage(argc >= 1 ? argv[0] : "ursacli");
                spdlog::error("Failed to parse command line.");
                return 1;
        }
    }

    if (argc - optind > 1) {
        spdlog::error("Too many positional arguments provided.");
        print_usage(argc >= 1 ? argv[0] : "ursacli");
        return 1;
    }
    if (argc - optind == 1) {
        server_addr = argv[optind];
    }

    try {
        UrsaClient client(std::move(server_addr), is_interactive, raw_json);
        if (!db_command.empty()) {
            client.one_shot_command(db_command);
        } else {
            client.start();
        }
    } catch (const std::runtime_error &ex) {
        spdlog::error("Runtime error: {}", ex.what());
        return 1;
    } catch (const zmq::error_t &ex) {
        spdlog::error("ZeroMQ error: {}", ex.what());
        return 1;
    }
}